

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

void byte_swap(char *buf,int len)

{
  ushort *puVar1;
  undefined1 auVar2 [16];
  
  if (len != 2) {
    if (len != 4) {
      if (len != 8) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x70a,"void byte_swap(char *, int)");
      }
      *(ulong *)buf = CONCAT44((int)*(undefined8 *)buf,(int)((ulong)*(undefined8 *)buf >> 0x20));
      byte_swap(buf + 4,4);
    }
    auVar2 = pshuflw(ZEXT416(*(uint *)buf),ZEXT416(*(uint *)buf),0xe1);
    *(int *)buf = auVar2._0_4_;
    puVar1 = (ushort *)(buf + 2);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  *(ushort *)buf = *(short *)buf << 8 | *(ushort *)buf >> 8;
  return;
}

Assistant:

static void
byte_swap(char *buf, int len)
{
    switch(len) {
    case 8: {
	int4 tmp;
	tmp = ((int4*) buf)[0];
	((int4*)buf)[0] = ((int4*) buf)[1];
	((int4*) buf)[1] = tmp;
	byte_swap(buf + 4, 4);
	/* falling through */
    }
    case 4: {
	int2 tmp;
	tmp = ((int2*) buf)[0];
	((int2*)buf)[0] = ((int2*) buf)[1];
	((int2*) buf)[1] = tmp;
	byte_swap(buf + 2, 2);
	/* falling through */
    }
    case 2: {
	char tmp;
	tmp = buf[0];
	buf[0] = buf[1];
	buf[1] = tmp;
	break;
    }
    default:
	assert(0);
    }
}